

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void FindActions(lemon *lemp)

{
  e_action eVar1;
  int iVar2;
  int iVar3;
  e_assoc eVar4;
  state *psVar5;
  symbol *psVar6;
  symbol *psVar7;
  state **ppsVar8;
  symbol *psVar9;
  action *paVar10;
  action *paVar11;
  rule *prVar12;
  uint uVar13;
  ulong uVar14;
  action *paVar15;
  int iVar16;
  config *pcVar17;
  long lVar18;
  long lVar19;
  
  if (0 < lemp->nstate) {
    lVar19 = 0;
    do {
      psVar5 = lemp->sorted[lVar19];
      pcVar17 = psVar5->cfp;
      if (pcVar17 != (config *)0x0) {
        do {
          if ((pcVar17->rp->nrhs == pcVar17->dot) && (0 < lemp->nterminal)) {
            lVar18 = 0;
            do {
              if (pcVar17->fws[lVar18] != '\0') {
                Action_add(&psVar5->ap,REDUCE,lemp->symbols[lVar18],(char *)pcVar17->rp);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < lemp->nterminal);
          }
          pcVar17 = pcVar17->next;
        } while (pcVar17 != (config *)0x0);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < lemp->nstate);
  }
  if (lemp->start == (char *)0x0) {
LAB_00103ea3:
    prVar12 = lemp->startRule;
  }
  else {
    psVar9 = Symbol_find(lemp->start);
    if (psVar9 != (symbol *)0x0) goto LAB_00103eaa;
    prVar12 = lemp->startRule;
    if (prVar12 == (rule *)0x0) {
      FindActions_cold_1();
      goto LAB_00103ea3;
    }
  }
  psVar9 = prVar12->lhs;
LAB_00103eaa:
  Action_add(&(*lemp->sorted)->ap,ACCEPT,psVar9,(char *)0x0);
  uVar13 = lemp->nstate;
  if (0 < (int)uVar13) {
    lVar19 = 0;
    do {
      psVar5 = lemp->sorted[lVar19];
      paVar10 = psVar5->ap;
      paVar10 = (action *)msort((char *)paVar10,(char **)&paVar10->next,actioncmp);
      psVar5->ap = paVar10;
      if (paVar10 != (action *)0x0) {
LAB_00103efb:
        paVar11 = paVar10;
        paVar10 = paVar11->next;
        if (paVar10 != (action *)0x0) {
          psVar9 = paVar11->sp;
          paVar15 = paVar10;
          do {
            if (paVar15->sp != psVar9) break;
            iVar16 = 0;
            if ((paVar11->type == SHIFT) && (paVar15->type == SHIFT)) {
              paVar15->type = SSCONFLICT;
              iVar16 = 1;
            }
            eVar1 = paVar11->type;
            if (eVar1 == REDUCE) {
              if (paVar15->type != REDUCE) goto LAB_00103ff2;
              psVar6 = ((paVar11->x).rp)->precsym;
              if ((((psVar6 == (symbol *)0x0) ||
                   (psVar7 = ((paVar15->x).rp)->precsym, psVar7 == (symbol *)0x0)) ||
                  (iVar2 = psVar6->prec, iVar2 < 0)) ||
                 ((iVar3 = psVar7->prec, iVar3 < 0 || (iVar2 == iVar3)))) {
                paVar15->type = RRCONFLICT;
                goto LAB_0010401f;
              }
              if (iVar3 < iVar2) goto LAB_00103fe9;
              if (iVar2 < iVar3) {
                paVar11->type = RD_RESOLVED;
              }
            }
            else if ((eVar1 == SHIFT) && (paVar15->type == REDUCE)) {
              psVar6 = ((paVar15->x).rp)->precsym;
              if (((psVar6 == (symbol *)0x0) || (iVar2 = psVar9->prec, iVar2 < 0)) ||
                 (iVar3 = psVar6->prec, iVar3 < 0)) {
                paVar15->type = SRCONFLICT;
LAB_0010401f:
                iVar16 = iVar16 + 1;
              }
              else if (iVar3 < iVar2) {
LAB_00103fe9:
                paVar15->type = RD_RESOLVED;
              }
              else {
                if (iVar3 <= iVar2) {
                  if (iVar2 != iVar3) {
LAB_00104118:
                    __assert_fail("spx->prec==spy->prec && spx->assoc==NONE",
                                  "/workspace/llm4binary/github/license_c_cmakelists/gwenn[P]lemon-rs/third_party/lemon/lemon.c"
                                  ,0x538,"int resolve_conflict(struct action *, struct action *)");
                  }
                  eVar4 = psVar9->assoc;
                  if (eVar4 != LEFT) {
                    if (eVar4 == NONE) {
                      paVar11->type = ERROR;
                      goto LAB_00104021;
                    }
                    if (eVar4 != RIGHT) goto LAB_00104118;
                    goto LAB_00103fe9;
                  }
                }
                paVar11->type = SH_RESOLVED;
              }
            }
            else {
LAB_00103ff2:
              if ((4 < eVar1 - SSCONFLICT) && (4 < paVar15->type - SSCONFLICT)) {
                __assert_fail("apx->type==SH_RESOLVED || apx->type==RD_RESOLVED || apx->type==SSCONFLICT || apx->type==SRCONFLICT || apx->type==RRCONFLICT || apy->type==SH_RESOLVED || apy->type==RD_RESOLVED || apy->type==SSCONFLICT || apy->type==SRCONFLICT || apy->type==RRCONFLICT"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/gwenn[P]lemon-rs/third_party/lemon/lemon.c"
                              ,0x553,"int resolve_conflict(struct action *, struct action *)");
              }
            }
LAB_00104021:
            lemp->nconflict = lemp->nconflict + iVar16;
            paVar15 = paVar15->next;
          } while (paVar15 != (action *)0x0);
          goto LAB_00103efb;
        }
      }
      lVar19 = lVar19 + 1;
      uVar13 = lemp->nstate;
    } while (lVar19 < (int)uVar13);
  }
  for (prVar12 = lemp->rule; prVar12 != (rule *)0x0; prVar12 = prVar12->next) {
    prVar12->canReduce = LEMON_FALSE;
  }
  if (0 < (int)uVar13) {
    ppsVar8 = lemp->sorted;
    uVar14 = 0;
    do {
      for (paVar10 = ppsVar8[uVar14]->ap; paVar10 != (action *)0x0; paVar10 = paVar10->next) {
        if (paVar10->type == REDUCE) {
          ((paVar10->x).rp)->canReduce = LEMON_TRUE;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar13);
  }
  for (prVar12 = lemp->rule; prVar12 != (rule *)0x0; prVar12 = prVar12->next) {
    if (prVar12->canReduce == LEMON_FALSE) {
      FindActions_cold_2();
    }
  }
  return;
}

Assistant:

void FindActions(struct lemon *lemp)
{
  int i,j;
  struct config *cfp;
  struct state *stp;
  struct symbol *sp;
  struct rule *rp;

  /* Add all of the reduce actions
  ** A reduce action is added for each element of the followset of
  ** a configuration which has its dot at the extreme right.
  */
  for(i=0; i<lemp->nstate; i++){   /* Loop over all states */
    stp = lemp->sorted[i];
    for(cfp=stp->cfp; cfp; cfp=cfp->next){  /* Loop over all configurations */
      if( cfp->rp->nrhs==cfp->dot ){        /* Is dot at extreme right? */
        for(j=0; j<lemp->nterminal; j++){
          if( SetFind(cfp->fws,j) ){
            /* Add a reduce action to the state "stp" which will reduce by the
            ** rule "cfp->rp" if the lookahead symbol is "lemp->symbols[j]" */
            Action_add(&stp->ap,REDUCE,lemp->symbols[j],(char *)cfp->rp);
          }
        }
      }
    }
  }

  /* Add the accepting token */
  if( lemp->start ){
    sp = Symbol_find(lemp->start);
    if( sp==0 ){
      if( lemp->startRule==0 ){
        fprintf(stderr, "internal error on source line %d: no start rule\n",
                __LINE__);
        exit(1);
      }
      sp = lemp->startRule->lhs;
    }
  }else{
    sp = lemp->startRule->lhs;
  }
  /* Add to the first state (which is always the starting state of the
  ** finite state machine) an action to ACCEPT if the lookahead is the
  ** start nonterminal.  */
  Action_add(&lemp->sorted[0]->ap,ACCEPT,sp,0);

  /* Resolve conflicts */
  for(i=0; i<lemp->nstate; i++){
    struct action *ap, *nap;
    stp = lemp->sorted[i];
    /* assert( stp->ap ); */
    stp->ap = Action_sort(stp->ap);
    for(ap=stp->ap; ap && ap->next; ap=ap->next){
      for(nap=ap->next; nap && nap->sp==ap->sp; nap=nap->next){
         /* The two actions "ap" and "nap" have the same lookahead.
         ** Figure out which one should be used */
         lemp->nconflict += resolve_conflict(ap,nap);
      }
    }
  }

  /* Report an error for each rule that can never be reduced. */
  for(rp=lemp->rule; rp; rp=rp->next) rp->canReduce = LEMON_FALSE;
  for(i=0; i<lemp->nstate; i++){
    struct action *ap;
    for(ap=lemp->sorted[i]->ap; ap; ap=ap->next){
      if( ap->type==REDUCE ) ap->x.rp->canReduce = LEMON_TRUE;
    }
  }
  for(rp=lemp->rule; rp; rp=rp->next){
    if( rp->canReduce ) continue;
    ErrorMsg(lemp->filename,rp->ruleline,"This rule can not be reduced.\n");
    lemp->errorcnt++;
  }
}